

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevII.cpp
# Opt level: O3

void __thiscall
Iir::ChebyshevII::AnalogLowPass::design(AnalogLowPass *this,int numPoles,double stopBandDb)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar6 [16];
  double local_b8;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  complex_t local_78;
  undefined4 local_68;
  uint uStack_64;
  undefined4 uStack_60;
  uint uStack_5c;
  double local_58;
  double local_48;
  
  if (this->m_numPoles == numPoles) {
    if ((this->m_stopBandDb == stopBandDb) && (!NAN(this->m_stopBandDb) && !NAN(stopBandDb))) {
      return;
    }
  }
  this->m_numPoles = numPoles;
  this->m_stopBandDb = stopBandDb;
  (this->super_LayoutBase).m_numPoles = 0;
  dVar4 = exp(stopBandDb * 0.1 * 2.302585092994046);
  dVar4 = 1.0 / (dVar4 + -1.0);
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar4 = 1.0 / dVar4;
  dVar4 = log(SQRT(dVar4 * dVar4 + 1.0) + dVar4);
  local_88 = sinh(dVar4 / (double)numPoles);
  uStack_80 = extraout_XMM0_Qb;
  local_58 = cosh(dVar4 / (double)numPoles);
  if (1 < numPoles) {
    dVar4 = 3.141592653589793 / (double)(numPoles * 2);
    uStack_64 = local_88._4_4_ ^ 0x80000000;
    uStack_5c = uStack_80._4_4_ ^ 0x80000000;
    local_68 = (undefined4)local_88;
    uStack_60 = (undefined4)uStack_80;
    iVar3 = 1 - numPoles;
    uVar2 = ((uint)numPoles >> 1) + 1;
    local_b8 = 1.0;
    do {
      dVar5 = (double)iVar3 * dVar4;
      local_48 = cos(dVar5);
      dVar5 = sin(dVar5);
      uStack_90 = cos(dVar4 * local_b8);
      uStack_90 = 1.0 / uStack_90;
      auVar6._0_8_ = (double)CONCAT44(uStack_64,local_68) * local_48;
      auVar6._8_8_ = dVar5 * local_58;
      dVar5 = auVar6._0_8_ * auVar6._0_8_ + auVar6._8_8_ * auVar6._8_8_;
      auVar1._8_8_ = dVar5;
      auVar1._0_8_ = dVar5;
      local_78._M_value = (_ComplexT)divpd(auVar6,auVar1);
      local_98 = (undefined1  [8])0x0;
      LayoutBase::addPoleZeroConjugatePairs(&this->super_LayoutBase,&local_78,(complex_t *)local_98)
      ;
      local_b8 = local_b8 + 2.0;
      iVar3 = iVar3 + 2;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  if ((numPoles & 1U) != 0) {
    local_78._M_value._8_8_ = 0;
    local_78._M_value._0_8_ = -1.0 / local_88;
    local_98 = (undefined1  [8])0x7ff0000000000000;
    uStack_90 = 0.0;
    LayoutBase::add(&this->super_LayoutBase,&local_78,(complex_t *)local_98);
  }
  return;
}

Assistant:

void AnalogLowPass::design (int numPoles,
                            double stopBandDb)
{
  if (m_numPoles != numPoles ||
      m_stopBandDb != stopBandDb)
  {
    m_numPoles = numPoles;
    m_stopBandDb = stopBandDb;

    reset ();

    const double eps = std::sqrt (1. / (std::exp (stopBandDb * 0.1 * doubleLn10) - 1));
    const double v0 = asinh (1 / eps) / numPoles;
    const double sinh_v0 = -sinh (v0);
    const double cosh_v0 = cosh (v0);
    const double fn = doublePi / (2 * numPoles);

    int k = 1;
    for (int i = numPoles / 2; --i >= 0; k+=2)
    {
      const double a = sinh_v0 * cos ((k - numPoles) * fn);
      const double b = cosh_v0 * sin ((k - numPoles) * fn);
      const double d2 = a * a + b * b;
      const double im = 1 / cos (k * fn);
      addPoleZeroConjugatePairs (complex_t (a / d2, b / d2),
                                       complex_t (0, im));
    }

    if (numPoles & 1)
    {
      add (1 / sinh_v0, infinity());
    }
  }
}